

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _treeBase.hpp
# Opt level: O3

void __thiscall
ft::treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>::rotateRight
          (treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_> *this,node *x)

{
  treeNode<int> *ptVar1;
  treeNode<int> *ptVar2;
  treeNode<int> **pptVar3;
  
  ptVar1 = x->left;
  ptVar2 = ptVar1->right;
  x->left = ptVar2;
  if (ptVar2 != (this->m_tree).NIL) {
    ptVar2->parent = x;
  }
  ptVar2 = x->parent;
  ptVar1->parent = ptVar2;
  if ((this->m_tree).m_root == x) {
    pptVar3 = &(this->m_tree).m_root;
  }
  else if (ptVar2->right == x) {
    pptVar3 = &ptVar2->right;
  }
  else {
    if (ptVar2->left != x) goto LAB_00108620;
    pptVar3 = &ptVar2->left;
  }
  *pptVar3 = ptVar1;
LAB_00108620:
  ptVar1->right = x;
  x->parent = ptVar1;
  return;
}

Assistant:

void rotateRight(node* x)
	{
		node*	y = x->left;

		x->left = y->right;
		if (y->right != this->NIL())
			y->right->parent = x;
		y->parent = x->parent;
		if (x == this->root())
			this->m_tree.m_root = y;
		else if (x == x->parent->right)
			x->parent->right = y;
		else if (x == x->parent->left)
			x->parent->left = y;
		y->right = x;
		x->parent = y;
	}